

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,char *pathname)

{
  int iVar1;
  Fl_Menu_Item *this_00;
  char *pcVar2;
  char local_848 [8];
  char itempath [1024];
  char *ss;
  Fl_Menu_Item *m;
  char local_428 [4];
  int t;
  char menupath [1024];
  char *pathname_local;
  Fl_Menu_ *this_local;
  
  memset(local_428,0,0x400);
  m._4_4_ = 0;
  do {
    iVar1 = size(this);
    if (iVar1 <= m._4_4_) {
      return -1;
    }
    this_00 = this->menu_ + m._4_4_;
    if ((this_00->flags & 0x40U) == 0) {
      pcVar2 = Fl_Menu_Item::label(this_00);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strrchr(local_428,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_428[0] = '\0';
        }
        else {
          *pcVar2 = '\0';
        }
      }
      else {
        strcpy(local_848,local_428);
        if (local_848[0] != '\0') {
          fl_strlcat(local_848,"/",0x400);
        }
        pcVar2 = Fl_Menu_Item::label(this_00);
        fl_strlcat(local_848,pcVar2,0x400);
        iVar1 = strcmp(local_848,pathname);
        if (iVar1 == 0) {
          return m._4_4_;
        }
      }
    }
    else {
      if (local_428[0] != '\0') {
        fl_strlcat(local_428,"/",0x400);
      }
      pcVar2 = Fl_Menu_Item::label(this_00);
      fl_strlcat(local_428,pcVar2,0x400);
      iVar1 = strcmp(local_428,pathname);
      if (iVar1 == 0) {
        return m._4_4_;
      }
    }
    m._4_4_ = m._4_4_ + 1;
  } while( true );
}

Assistant:

int Fl_Menu_::find_index(const char *pathname) const {
  char menupath[1024] = "";	// File/Export
  for ( int t=0; t < size(); t++ ) {
    Fl_Menu_Item *m = menu_ + t;
    if (m->flags&FL_SUBMENU) {
      // IT'S A SUBMENU
      // we do not support searches through FL_SUBMENU_POINTER links
      if (menupath[0]) strlcat(menupath, "/", sizeof(menupath));
      strlcat(menupath, m->label(), sizeof(menupath));
      if (!strcmp(menupath, pathname)) return(t);
    } else {
      if (!m->label()) {
	// END OF SUBMENU? Pop back one level.
	char *ss = strrchr(menupath, '/');
	if ( ss ) *ss = 0;
	else menupath[0] = '\0';
	continue;
      }
      // IT'S A MENU ITEM
      char itempath[1024];	// eg. Edit/Copy
      strcpy(itempath, menupath);
      if (itempath[0]) strlcat(itempath, "/", sizeof(itempath));
      strlcat(itempath, m->label(), sizeof(itempath));
      if (!strcmp(itempath, pathname)) return(t);
    }
  }
  return(-1);
}